

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

void __thiscall xemmai::t_emit::f_emit_safe_point(t_emit *this,t_node *a_node)

{
  vector<std::tuple<unsigned_long,unsigned_long,unsigned_long>,std::allocator<std::tuple<unsigned_long,unsigned_long,unsigned_long>>>
  *this_00;
  size_t local_20;
  t_node *local_18;
  t_node *a_node_local;
  t_emit *this_local;
  
  if (this->v_safe_points !=
      (map<std::pair<unsigned_long,_void_**>,_unsigned_long,_std::less<std::pair<unsigned_long,_void_**>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_void_**>,_unsigned_long>_>_>
       *)0x0) {
    this_00 = (vector<std::tuple<unsigned_long,unsigned_long,unsigned_long>,std::allocator<std::tuple<unsigned_long,unsigned_long,unsigned_long>>>
               *)this->v_safe_positions;
    local_18 = a_node;
    a_node_local = (t_node *)this;
    local_20 = f_last(this);
    std::
    vector<std::tuple<unsigned_long,unsigned_long,unsigned_long>,std::allocator<std::tuple<unsigned_long,unsigned_long,unsigned_long>>>
    ::emplace_back<unsigned_long_const&,unsigned_long,unsigned_long_const&>
              (this_00,&(a_node->v_at).v_line,&local_20,&(local_18->v_at).v_column);
    operator<<(this,c_instruction__SAFE_POINT);
    f_at(this,local_18);
  }
  return;
}

Assistant:

void f_emit_safe_point(ast::t_node* a_node)
	{
		if (!v_safe_points) return;
		v_safe_positions->emplace_back(a_node->v_at.v_line, f_last(), a_node->v_at.v_column);
		*this << c_instruction__SAFE_POINT;
		f_at(a_node);
	}